

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O1

Abc_Cex_t * Llb4_Nonlin4NormalizeCex(Aig_Man_t *pAigOrg,Aig_Man_t *pAigRpm,Abc_Cex_t *pCexRpm)

{
  Vec_Ptr_t *vStates;
  Abc_Cex_t *pAVar1;
  int in_ECX;
  char *__s;
  
  if (pAigOrg->nRegs == pAigRpm->nRegs) {
    if (pAigRpm->nTruePis == pCexRpm->nPis) {
      pAVar1 = pCexRpm;
      vStates = Llb4_Nonlin4VerifyCex(pAigRpm,pCexRpm);
      if (vStates != (Vec_Ptr_t *)0x0) {
        pAVar1 = Llb4_Nonlin4TransformCex(pAigOrg,vStates,pCexRpm->iPo,in_ECX);
        if (vStates->pArray != (void **)0x0) {
          free(vStates->pArray);
          vStates->pArray = (void **)0x0;
        }
        free(vStates);
        return pAVar1;
      }
      Abc_Print((int)pAigRpm,(char *)pAVar1);
      return (Abc_Cex_t *)0x0;
    }
    __s = 
    "Llb4_Nonlin4NormalizeCex(): The number of PIs in the reparametrized AIG and in the CEX do not agree."
    ;
  }
  else {
    __s = 
    "Llb4_Nonlin4NormalizeCex(): The number of flops in the original and reparametrized AIGs do not agree."
    ;
  }
  puts(__s);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Llb4_Nonlin4NormalizeCex( Aig_Man_t * pAigOrg, Aig_Man_t * pAigRpm, Abc_Cex_t * pCexRpm )
{
    Abc_Cex_t * pCexOrg;
    Vec_Ptr_t * vStates;
    // check parameters of the AIG
    if ( Saig_ManRegNum(pAigOrg) != Saig_ManRegNum(pAigRpm) )
    {
        printf( "Llb4_Nonlin4NormalizeCex(): The number of flops in the original and reparametrized AIGs do not agree.\n" );
        return NULL;
    }
/*
    if ( Saig_ManRegNum(pAigRpm) != pCexRpm->nRegs )
    {
        printf( "Llb4_Nonlin4NormalizeCex(): The number of flops in the reparametrized AIG and in the CEX do not agree.\n" );
        return NULL;
    }
*/
    if ( Saig_ManPiNum(pAigRpm) != pCexRpm->nPis )
    {
        printf( "Llb4_Nonlin4NormalizeCex(): The number of PIs in the reparametrized AIG and in the CEX do not agree.\n" );
        return NULL;
    }
    // get the sequence of states
    vStates = Llb4_Nonlin4VerifyCex( pAigRpm, pCexRpm );
    if ( vStates == NULL )
    {
        Abc_Print( 1, "Llb4_Nonlin4NormalizeCex(): The given CEX does not fail outputs of pAigRpm.\n" );
        return NULL;
    }
    // derive updated counter-example
    pCexOrg = Llb4_Nonlin4TransformCex( pAigOrg, vStates, pCexRpm->iPo, 0 );
    Vec_PtrFree( vStates );
    return pCexOrg;
}